

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  uint64_t *puVar1;
  vec<Minisat::Lit,_int> *out_clause;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  Size SVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  vec<unsigned_int,_int> *pvVar9;
  long extraout_RAX;
  long extraout_RAX_00;
  undefined7 uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  int iVar14;
  vec<unsigned_int,_int> *this_00;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  vec<Minisat::Solver::Watcher,_int> *pvVar18;
  long lVar19;
  bool bVar20;
  vec<unsigned_int,_int> neg;
  int clause_size;
  Var local_a0;
  byte local_9a;
  byte local_99;
  vec<unsigned_int,_int> local_98;
  vec<unsigned_int,_int> local_88;
  uint local_6c;
  uint *local_68;
  int local_60;
  Var local_5c;
  vec<unsigned_int,_int> *local_58;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_50;
  ulong local_48;
  long local_40;
  uint *local_38;
  
  local_a0 = v;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
  goto LAB_00112487;
  if ((this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e7,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v) {
    pcVar13 = 
    "const V &Minisat::IntMap<int, char>::operator[](K) const [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
LAB_0011250b:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,pcVar13);
  }
  if ((this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0')
  {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e8,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  if ((this->super_Solver).assigns.super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
      map.sz <= v) {
    pcVar13 = 
    "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
    goto LAB_0011250b;
  }
  bVar7 = (this->super_Solver).assigns.
          super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data[v].value;
  if ((bVar7 != l_Undef || (l_Undef & 2) != 0) && (l_Undef & 2 & bVar7) == 0) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e9,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  local_50 = &this->occurs;
  pvVar9 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(local_50,&local_a0);
  local_88.data = (uint *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  local_98.data = (uint *)0x0;
  local_98.sz = 0;
  local_98.cap = 0;
  if (0 < pvVar9->sz) {
    lVar16 = 0;
    do {
      uVar2 = pvVar9->data[lVar16];
      if ((this->super_Solver).ca.ra.sz <= uVar2) goto LAB_00112468;
      puVar3 = (this->super_Solver).ca.ra.memory;
      bVar20 = 0x1f < puVar3[uVar2];
      if (bVar20) {
        bVar20 = true;
        if (puVar3[(ulong)uVar2 + 1] != local_a0 * 2) {
          uVar11 = (ulong)(puVar3[uVar2] >> 5);
          uVar17 = 1;
          do {
            uVar15 = uVar17;
            if (uVar11 == uVar15) break;
            uVar17 = uVar15 + 1;
          } while (puVar3[(ulong)uVar2 + uVar15 + 1] != local_a0 * 2);
          bVar20 = uVar15 < uVar11;
        }
      }
      this_00 = &local_98;
      if (bVar20) {
        this_00 = &local_88;
      }
      vec<unsigned_int,_int>::push(this_00,pvVar9->data + lVar16);
      lVar16 = lVar16 + 1;
    } while (lVar16 < pvVar9->sz);
  }
  local_60 = 0;
  local_48 = (ulong)local_88.sz;
  bVar20 = 0 < (long)local_48;
  local_58 = pvVar9;
  if (0 < (long)local_48) {
    SVar5 = local_98.sz;
    lVar16 = (long)local_98.sz;
    local_9a = 0 < lVar16;
    local_68 = local_88.data;
    local_38 = local_98.data;
    local_5c = local_a0;
    local_40 = -(local_98._8_8_ & 0xffffffff);
    uVar17 = 0;
    iVar8 = 0;
    do {
      bVar7 = local_9a;
      local_99 = bVar20;
      if (0 < SVar5) {
        lVar19 = 1;
        iVar14 = iVar8;
        do {
          uVar2 = (this->super_Solver).ca.ra.sz;
          if ((uVar2 <= local_68[uVar17]) || (uVar2 <= local_38[lVar19 + -1])) goto LAB_00112468;
          puVar3 = (this->super_Solver).ca.ra.memory;
          bVar20 = merge(this,(Clause *)(puVar3 + local_68[uVar17]),
                         (Clause *)(puVar3 + local_38[lVar19 + -1]),local_5c,&local_60);
          iVar8 = iVar14;
          if ((bVar20) &&
             ((iVar8 = iVar14 + 1,
              *(int *)&(this->super_Solver).field_0x35c + local_58->sz <= iVar14 ||
              ((this->clause_lim != -1 && (this->clause_lim < local_60)))))) break;
          bVar7 = lVar19 < lVar16;
          lVar12 = local_40 + lVar19;
          lVar19 = lVar19 + 1;
          iVar14 = iVar8;
        } while (lVar12 != 0);
      }
      if ((bVar7 & 1) != 0) {
        bVar7 = 1;
        if ((local_99 & 1) != 0) goto LAB_0011240f;
        break;
      }
      uVar17 = uVar17 + 1;
      bVar20 = uVar17 < local_48;
    } while (uVar17 != local_48);
  }
  pvVar9 = local_58;
  if (local_a0 < (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz) {
    (this->eliminated).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[local_a0] =
         '\x01';
    lVar16 = (long)local_a0;
    if (local_a0 <
        (this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz)
    {
      pcVar13 = (this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>
                .map.data;
      if (pcVar13[lVar16] != '\0') {
        puVar1 = &(this->super_Solver).dec_vars;
        *puVar1 = *puVar1 - 1;
      }
      pcVar13[lVar16] = '\0';
      if (((this->super_Solver).order_heap.indices.map.sz <= local_a0) ||
         ((this->super_Solver).order_heap.indices.map.data[lVar16] < 0)) {
        if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map
            .sz <= local_a0) goto LAB_00112487;
        if ((this->super_Solver).decision.super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map
            .data[lVar16] != '\0') {
          Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                    (&(this->super_Solver).order_heap,local_a0);
        }
      }
      this->eliminated_vars = this->eliminated_vars + 1;
      if (local_98.sz < local_88.sz) {
        if (0 < local_98.sz) {
          lVar16 = 0;
          do {
            if ((this->super_Solver).ca.ra.sz <= local_98.data[lVar16]) {
LAB_00112468:
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            mkElimClause(&this->elimclauses,local_a0,
                         (Clause *)((this->super_Solver).ca.ra.memory + local_98.data[lVar16]));
            lVar16 = lVar16 + 1;
          } while (lVar16 < local_98.sz);
        }
        local_6c = local_a0 * 2;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_6c);
        local_6c = 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_6c);
        lVar16 = extraout_RAX;
      }
      else {
        if (0 < local_88.sz) {
          lVar16 = 0;
          do {
            if ((this->super_Solver).ca.ra.sz <= local_88.data[lVar16]) goto LAB_00112468;
            mkElimClause(&this->elimclauses,local_a0,
                         (Clause *)((this->super_Solver).ca.ra.memory + local_88.data[lVar16]));
            lVar16 = lVar16 + 1;
          } while (lVar16 < local_88.sz);
        }
        local_6c = local_a0 * 2 + 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_6c);
        local_6c = 1;
        vec<unsigned_int,_int>::push(&this->elimclauses,&local_6c);
        lVar16 = extraout_RAX_00;
      }
      if (0 < pvVar9->sz) {
        lVar19 = 0;
        do {
          removeClause(this,pvVar9->data[lVar19]);
          lVar19 = lVar19 + 1;
          lVar16 = (long)pvVar9->sz;
        } while (lVar19 < lVar16);
      }
      bVar20 = 0 < local_88.sz;
      uVar10 = (undefined7)((ulong)lVar16 >> 8);
      if (local_88.sz < 1) {
        local_68 = (uint *)CONCAT44(local_68._4_4_,(int)CONCAT71(uVar10,1));
      }
      else {
        out_clause = &(this->super_Solver).add_tmp;
        local_68 = (uint *)CONCAT44(local_68._4_4_,(int)CONCAT71(uVar10,1));
        lVar16 = 0;
        do {
          bVar4 = 0 < local_98.sz;
          if (0 < local_98.sz) {
            lVar19 = 0;
            do {
              uVar2 = (this->super_Solver).ca.ra.sz;
              if ((uVar2 <= local_88.data[lVar16]) || (uVar2 <= local_98.data[lVar19]))
              goto LAB_00112468;
              puVar3 = (this->super_Solver).ca.ra.memory;
              bVar6 = merge(this,(Clause *)(puVar3 + local_88.data[lVar16]),
                            (Clause *)(puVar3 + local_98.data[lVar19]),local_a0,out_clause);
              if ((bVar6) && (bVar6 = addClause_(this,out_clause), !bVar6)) {
                local_68 = (uint *)((ulong)local_68 & 0xffffffff00000000);
                break;
              }
              lVar19 = lVar19 + 1;
              bVar4 = lVar19 < local_98.sz;
            } while (lVar19 < local_98.sz);
          }
          if (bVar4) break;
          lVar16 = lVar16 + 1;
          bVar20 = lVar16 < local_88.sz;
        } while (lVar16 < local_88.sz);
      }
      bVar7 = (byte)local_68;
      if (bVar20) {
LAB_0011240f:
        if (local_98.data != (uint *)0x0) {
          local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
          free(local_98.data);
          local_98.data = (uint *)0x0;
          local_98._8_8_ = local_98._8_8_ & 0xffffffff;
        }
        if (local_88.data != (uint *)0x0) {
          local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
          free(local_88.data);
        }
        return (bool)(bVar7 & 1);
      }
      if (local_a0 < (this->occurs).occs.map.sz) {
        pvVar9 = (local_50->occs).map.data;
        puVar3 = pvVar9[local_a0].data;
        if (puVar3 != (uint *)0x0) {
          pvVar9 = pvVar9 + local_a0;
          pvVar9->sz = 0;
          free(puVar3);
          pvVar9->data = (uint *)0x0;
          pvVar9->cap = 0;
        }
        if (local_a0 * 2 < (this->super_Solver).watches.occs.map.sz) {
          pvVar18 = (this->super_Solver).watches.occs.map.data;
          if (pvVar18[(long)local_a0 * 2].sz == 0) {
            pvVar18 = pvVar18 + (long)local_a0 * 2;
            if (pvVar18->data != (Watcher *)0x0) {
              pvVar18->sz = 0;
              free(pvVar18->data);
              pvVar18->data = (Watcher *)0x0;
              pvVar18->cap = 0;
            }
          }
          lVar16 = (long)local_a0 * 2 + 1;
          if ((int)lVar16 < (this->super_Solver).watches.occs.map.sz) {
            pvVar18 = (this->super_Solver).watches.occs.map.data;
            if (pvVar18[lVar16].sz == 0) {
              pvVar18 = pvVar18 + lVar16;
              if (pvVar18->data != (Watcher *)0x0) {
                pvVar18->sz = 0;
                free(pvVar18->data);
                pvVar18->data = (Watcher *)0x0;
                pvVar18->cap = 0;
              }
            }
            bVar7 = backwardSubsumptionCheck(this,false);
            goto LAB_0011240f;
          }
        }
        pcVar13 = 
        "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
        ;
      }
      else {
        pcVar13 = 
        "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
      }
      goto LAB_00112560;
    }
  }
LAB_00112487:
  pcVar13 = 
  "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
  ;
LAB_00112560:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,pcVar13);
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]); 

    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    // Free occurs list for this variable:
    occurs[v].clear(true);
    
    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}